

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::
findNextLeaf(FastGeneralizationsIterator *this)

{
  long lVar1;
  long lVar2;
  TermList nodeTerm;
  TermList nodeTerm_00;
  FastGeneralizationsIterator *pFVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  NodeAlgorithm *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  GenMatcher *this_00;
  TermList *pTVar11;
  long in_RDI;
  uint specVar;
  Node *alts_1;
  Node **alts;
  NodeAlgorithm parentType;
  void *currAlt;
  uint currSpecVar;
  bool sibilingsRemain;
  Node *curr;
  void *in_stack_ffffffffffffff48;
  GenMatcher *in_stack_ffffffffffffff50;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *this_01;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff70;
  byte local_7b;
  byte local_7a;
  bool local_79;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> local_60;
  uint64_t local_58;
  undefined4 local_4c;
  uint64_t local_48;
  FastGeneralizationsIterator *local_40;
  FastGeneralizationsIterator *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  NodeAlgorithm in_stack_ffffffffffffffd4;
  FastGeneralizationsIterator *in_stack_ffffffffffffffd8;
  uint local_20;
  bool local_19;
  Node *local_18;
  
  local_19 = false;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    if (*(long *)(in_RDI + 0xa0) != 0) {
      local_18 = *(Node **)(in_RDI + 0xa0);
      *(undefined8 *)(in_RDI + 0xa0) = 0;
      local_19 = enterNode(in_stack_ffffffffffffffd8,
                           (Node **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      goto LAB_003cd048;
    }
  }
  else {
    bVar4 = Lib::Stack<void_*>::isEmpty((Stack<void_*> *)(in_RDI + 0xa8));
    if (!bVar4) {
      SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                (in_stack_ffffffffffffff50);
      *(undefined1 *)(in_RDI + 1) = 0;
      local_18 = (Node *)0x0;
LAB_003cd048:
      do {
        local_20 = 0;
        if (local_18 != (Node *)0x0) {
          if (local_19 == false) {
            local_20 = Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)(in_RDI + 200));
          }
          else {
            puVar7 = Lib::Stack<unsigned_int>::top((Stack<unsigned_int> *)(in_RDI + 200));
            local_20 = *puVar7;
          }
        }
        do {
          while( true ) {
            local_79 = false;
            if (local_18 == (Node *)0x0) {
              local_79 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0xa8));
            }
            if (local_79 == false) goto LAB_003cd397;
            in_stack_ffffffffffffffd8 =
                 (FastGeneralizationsIterator *)
                 Lib::Stack<void_*>::pop((Stack<void_*> *)(in_RDI + 0xa8));
            if (in_stack_ffffffffffffffd8 != (FastGeneralizationsIterator *)0x0) break;
            Lib::
            Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
            ::pop((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
                   *)(in_RDI + 0xe8));
            Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)(in_RDI + 200));
            bVar4 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0xa8));
            if (bVar4) {
              SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                        (in_stack_ffffffffffffff50);
            }
          }
          pNVar8 = Lib::
                   Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
                   ::top((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
                          *)(in_RDI + 0xe8));
          in_stack_ffffffffffffffd4 = *pNVar8;
          pFVar3 = in_stack_ffffffffffffffd8;
          if (in_stack_ffffffffffffffd4 == UNSORTED_LIST) {
            while( true ) {
              local_38 = pFVar3;
              lVar1._0_1_ = local_38->_retrieveSubstitution;
              lVar1._1_1_ = local_38->_inLeaf;
              lVar1._2_6_ = *(undefined6 *)&local_38->field_0x2;
              local_7a = 0;
              if (lVar1 != 0) {
                SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term
                          (*(Node **)local_38);
                bVar4 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff50);
                local_7a = bVar4 ^ 0xff;
              }
              if ((local_7a & 1) == 0) break;
              pFVar3 = (FastGeneralizationsIterator *)&local_38->_subst;
            }
            local_18 = *(Node **)local_38;
            do {
              local_38 = (FastGeneralizationsIterator *)&local_38->_subst;
              local_7b = 0;
              if (((VarStack *)&local_38->_retrieveSubstitution)->_capacity != 0) {
                SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term
                          ((Node *)((VarStack *)&local_38->_retrieveSubstitution)->_capacity);
                bVar4 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff50);
                local_7b = bVar4 ^ 0xff;
              }
            } while ((local_7b & 1) != 0);
            lVar2._0_1_ = local_38->_retrieveSubstitution;
            lVar2._1_1_ = local_38->_inLeaf;
            lVar2._2_6_ = *(undefined6 *)&local_38->field_0x2;
            local_19 = lVar2 != 0;
            if (local_19) {
              Lib::Stack<void_*>::push
                        ((Stack<void_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
            }
          }
          else {
            local_40 = in_stack_ffffffffffffffd8;
            pNVar9 = Lib::
                     SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                     ::Node::head((Node *)in_stack_ffffffffffffffd8);
            SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(pNVar9);
            bVar4 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff50);
            if (bVar4) {
              local_18 = Lib::
                         SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                         ::Node::head((Node *)local_40);
              pNVar10 = Lib::
                        SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                        ::Node::tail((Node *)local_40);
              if (pNVar10 != (Node *)0x0) {
                pNVar10 = Lib::
                          SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                          ::Node::tail((Node *)local_40);
                pNVar9 = Lib::
                         SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                         ::Node::head(pNVar10);
                SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(pNVar9);
                bVar4 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffff50);
                if (bVar4) {
                  Lib::
                  SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
                  ::Node::tail((Node *)local_40);
                  Lib::Stack<void_*>::push
                            ((Stack<void_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
                  local_19 = true;
                  goto LAB_003cd336;
                }
              }
              local_19 = false;
            }
          }
LAB_003cd336:
          if (local_19 == false) {
            Lib::
            Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
            ::pop((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::NodeAlgorithm>
                   *)(in_RDI + 0xe8));
            local_20 = Lib::Stack<unsigned_int>::pop((Stack<unsigned_int> *)(in_RDI + 200));
          }
          else {
            puVar7 = Lib::Stack<unsigned_int>::top((Stack<unsigned_int> *)(in_RDI + 200));
            local_20 = *puVar7;
          }
        } while (local_18 == (Node *)0x0);
LAB_003cd397:
        if (local_18 == (Node *)0x0) {
          return false;
        }
        this_00 = (GenMatcher *)(in_RDI + 8);
        pTVar11 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(local_18);
        local_48 = pTVar11->_content;
        nodeTerm._content._4_4_ = local_20;
        nodeTerm._content._0_4_ = in_stack_ffffffffffffff70;
        bVar4 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNext
                          (this_00,in_stack_ffffffffffffff64,nodeTerm,
                           SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
        if (!bVar4) {
          local_18 = (Node *)0x0;
          if ((local_19 == false) &&
             (bVar4 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0xa8)), bVar4)) {
            SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                      (in_stack_ffffffffffffff50);
          }
          goto LAB_003cd048;
        }
        do {
          uVar5 = (*local_18->_vptr_Node[2])();
          uVar12 = in_stack_ffffffffffffff64 & 0xffffff;
          in_stack_ffffffffffffff64 = uVar12;
          if ((uVar5 & 1) == 0) {
            iVar6 = (*local_18->_vptr_Node[5])();
            in_stack_ffffffffffffff64 = uVar12 & 0xffffff;
            if (iVar6 == 1) {
              in_stack_ffffffffffffff64 =
                   CONCAT13(*(int *)((long)&local_18[1]._vptr_Node + 4) == 1,(int3)uVar12);
            }
          }
          if ((char)(in_stack_ffffffffffffff64 >> 0x18) == '\0') {
            uVar5 = (*local_18->_vptr_Node[2])();
            if ((uVar5 & 1) != 0) {
              this_01 = &local_60;
              (*local_18->_vptr_Node[8])();
              Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::operator=
                        ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
              Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::~VirtualIterator
                        (this_01);
              *(undefined1 *)(in_RDI + 1) = 1;
              return true;
            }
            local_19 = enterNode(in_stack_ffffffffffffffd8,
                                 (Node **)CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0));
            if ((local_18 == (Node *)0x0) &&
               (bVar4 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0xa8)), bVar4)) {
              SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                        (in_stack_ffffffffffffff50);
            }
            goto LAB_003cd048;
          }
          in_stack_ffffffffffffff60 = *(undefined4 *)&local_18[1]._vptr_Node;
          local_18 = (Node *)local_18[1]._term._content;
          in_stack_ffffffffffffff58 =
               (VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)(in_RDI + 8);
          local_4c = in_stack_ffffffffffffff60;
          pTVar11 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(local_18);
          local_58 = pTVar11->_content;
          nodeTerm_00._content._4_4_ = local_20;
          nodeTerm_00._content._0_4_ = in_stack_ffffffffffffff70;
          bVar4 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNext
                            (this_00,in_stack_ffffffffffffff64,nodeTerm_00,
                             SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
        } while (bVar4);
        if ((local_19 != false) ||
           (bVar4 = Lib::Stack<void_*>::isNonEmpty((Stack<void_*> *)(in_RDI + 0xa8)), bVar4)) {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                    (in_stack_ffffffffffffff50);
        }
        local_18 = (Node *)0x0;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
	ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
	currSpecVar=_specVarNumbers.top();
      } else {
	currSpecVar=_specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
	//there's no alternative at this level, we have to backtrack
	_nodeTypes.pop();
	_specVarNumbers.pop();
	if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType=_nodeTypes.top();

      //proper term nodes that we want to enter don't appear
      //on _alternatives stack (as we always enter them first)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	curr=*(alts++);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	if(alts->head()->term().isVar()) {
	  curr=alts->head();
	  if(alts->tail() && alts->tail()->head()->term().isVar()) {
	    _alternatives.push(alts->tail());
	    sibilingsRemain=true;
	  } else {
	    sibilingsRemain=false;
	  }
	}
      }

      if(sibilingsRemain) {
	currSpecVar=_specVarNumbers.top();
      } else {
	_nodeTypes.pop();
	currSpecVar=_specVarNumbers.pop();
      }
      if(curr) {
	break;
      }
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
        _subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst->backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}